

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

void xmlDictFree(xmlDictPtr dict)

{
  xmlDictStringsPtr pxVar1;
  xmlDictStringsPtr_conflict nextp;
  xmlDictStringsPtr_conflict pool;
  xmlDictPtr dict_local;
  
  if (dict != (xmlDictPtr)0x0) {
    xmlMutexLock(&xmlDictMutex);
    dict->ref_counter = dict->ref_counter + -1;
    if (dict->ref_counter < 1) {
      xmlMutexUnlock(&xmlDictMutex);
      if (dict->subdict != (_xmlDict *)0x0) {
        xmlDictFree(dict->subdict);
      }
      if (dict->table != (xmlDictEntry *)0x0) {
        (*xmlFree)(dict->table);
      }
      nextp = dict->strings;
      while (nextp != (xmlDictStringsPtr_conflict)0x0) {
        pxVar1 = nextp->next;
        (*xmlFree)(nextp);
        nextp = pxVar1;
      }
      (*xmlFree)(dict);
    }
    else {
      xmlMutexUnlock(&xmlDictMutex);
    }
  }
  return;
}

Assistant:

void
xmlDictFree(xmlDictPtr dict) {
    xmlDictStringsPtr pool, nextp;

    if (dict == NULL)
	return;

    /* decrement the counter, it may be shared by a parser and docs */
    xmlMutexLock(&xmlDictMutex);
    dict->ref_counter--;
    if (dict->ref_counter > 0) {
        xmlMutexUnlock(&xmlDictMutex);
        return;
    }

    xmlMutexUnlock(&xmlDictMutex);

    if (dict->subdict != NULL) {
        xmlDictFree(dict->subdict);
    }

    if (dict->table) {
	xmlFree(dict->table);
    }
    pool = dict->strings;
    while (pool != NULL) {
        nextp = pool->next;
	xmlFree(pool);
	pool = nextp;
    }
    xmlFree(dict);
}